

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O0

void __thiscall
directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
for_each_cell<directed_flag_complex_in_memory_computer::compute_filtration_t>
          (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *this,compute_filtration_t *f,
          int min_dimension,int max_dimension)

{
  initializer_list<directed_flag_complex_in_memory_computer::compute_filtration_t> __l;
  size_type in_RDI;
  undefined1 *puVar1;
  vector<directed_flag_complex_in_memory_computer::compute_filtration_t,_std::allocator<directed_flag_complex_in_memory_computer::compute_filtration_t>_>
  fs;
  compute_filtration_t *in_stack_ffffffffffffff18;
  compute_filtration_t *in_stack_ffffffffffffff20;
  vector<directed_flag_complex_in_memory_computer::compute_filtration_t,_std::allocator<directed_flag_complex_in_memory_computer::compute_filtration_t>_>
  *in_stack_ffffffffffffff30;
  allocator_type *in_stack_ffffffffffffff48;
  undefined1 *puVar2;
  vector<directed_flag_complex_in_memory_computer::compute_filtration_t,_std::allocator<directed_flag_complex_in_memory_computer::compute_filtration_t>_>
  *in_stack_ffffffffffffff50;
  iterator pcVar3;
  undefined1 local_95 [69];
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  vector<directed_flag_complex_in_memory_computer::compute_filtration_t,_std::allocator<directed_flag_complex_in_memory_computer::compute_filtration_t>_>
  *in_stack_ffffffffffffffb8;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *this_00;
  
  local_95._13_8_ = local_95 + 0x15;
  directed_flag_complex_in_memory_computer::compute_filtration_t::compute_filtration_t
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  this_00 = (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *)(local_95 + 0x15);
  pcVar3 = (iterator)local_95;
  std::allocator<directed_flag_complex_in_memory_computer::compute_filtration_t>::allocator
            ((allocator<directed_flag_complex_in_memory_computer::compute_filtration_t> *)0x1dc3c3);
  __l._M_len = in_RDI;
  __l._M_array = pcVar3;
  std::
  vector<directed_flag_complex_in_memory_computer::compute_filtration_t,_std::allocator<directed_flag_complex_in_memory_computer::compute_filtration_t>_>
  ::vector(in_stack_ffffffffffffff50,__l,in_stack_ffffffffffffff48);
  std::allocator<directed_flag_complex_in_memory_computer::compute_filtration_t>::~allocator
            ((allocator<directed_flag_complex_in_memory_computer::compute_filtration_t> *)0x1dc3f1);
  puVar2 = local_95 + 0x15;
  puVar1 = &stack0xffffffffffffffc0;
  do {
    puVar1 = puVar1 + -0x40;
    directed_flag_complex_in_memory_computer::compute_filtration_t::~compute_filtration_t
              ((compute_filtration_t *)0x1dc417);
  } while (puVar1 != puVar2);
  for_each_cell<directed_flag_complex_in_memory_computer::compute_filtration_t>
            (this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  std::
  vector<directed_flag_complex_in_memory_computer::compute_filtration_t,_std::allocator<directed_flag_complex_in_memory_computer::compute_filtration_t>_>
  ::~vector(in_stack_ffffffffffffff30);
  return;
}

Assistant:

void for_each_cell(Func& f, int min_dimension, int max_dimension = -1) {
		std::vector<Func> fs{{f}};
		for_each_cell(fs, min_dimension, max_dimension);
	}